

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

uint * ON_BinarySearchUnsignedIntArray(uint key,uint *base,size_t nel)

{
  bool bVar1;
  ulong uVar2;
  
  if (base == (uint *)0x0 || nel == 0) {
    return (uint *)0x0;
  }
  if (key < *base) {
LAB_004f4e8f:
    base = (uint *)0x0;
  }
  else if (*base != key) {
    if (base[nel - 1] < key) goto LAB_004f4e8f;
    if (base[nel - 1] != key) {
      do {
        uVar2 = nel >> 1;
        if (base[uVar2] <= key) {
          if (key <= base[uVar2]) {
            base = base + uVar2;
            goto LAB_004f4e95;
          }
          base = base + uVar2 + 1;
          uVar2 = nel - (uVar2 + 1);
        }
        nel = uVar2;
      } while (uVar2 != 0);
      bVar1 = true;
      goto LAB_004f4e97;
    }
    base = base + (nel - 1);
  }
LAB_004f4e95:
  bVar1 = false;
LAB_004f4e97:
  if (bVar1) {
    return (uint *)0x0;
  }
  return base;
}

Assistant:

const unsigned int* ON_BinarySearchUnsignedIntArray( unsigned int key, const unsigned int* base, size_t nel )
{
  if (nel > 0 && base )
  {
    size_t i;
    unsigned int d;

    // The end tests are not necessary, but they
    // seem to provide overall speed improvement
    // for the types of searches that call this
    // function.
    d = base[0];
    if ( key < d )
      return 0;
    if ( key == d )
      return base;

    d = base[nel-1];
    if ( key > d )
      return 0;
    if ( key == d )
      return (base + (nel-1));

    while ( nel > 0 )
    {
      i = nel/2;
      d = base[i];
      if ( key < d )
      {
        nel = i;
      }
      else if ( key > d )
      {
        i++;
        base += i;
        nel -= i;
      }
      else
      {
        return base+i;
      }
    }
  }
  return 0;
}